

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::getInputs
          (ShaderAtomicOrCase *this,int numValues,int stride,void *inputs)

{
  deUint32 seed;
  uint uVar1;
  int iVar2;
  char *str;
  int local_6c;
  int local_58;
  int localNdx;
  int groupOffset;
  int groupNdx;
  int numBits;
  int numWorkGroups;
  undefined1 local_30 [4];
  int workGroupSize;
  Random rnd;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicOrCase *this_local;
  
  rnd.m_rnd._8_8_ = inputs;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)local_30,seed);
  uVar1 = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_HIGHP) {
    local_6c = 0x20;
  }
  else {
    local_6c = 8;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_MEDIUMP) {
      local_6c = 0x10;
    }
  }
  for (localNdx = 0; localNdx < numValues / (int)uVar1; localNdx = localNdx + 1) {
    for (local_58 = 0; local_58 < (int)uVar1; local_58 = local_58 + 1) {
      iVar2 = de::Random::getInt((Random *)local_30,0,local_6c + -1);
      *(int *)(rnd.m_rnd._8_8_ + (long)(int)(stride * (localNdx * uVar1 + local_58))) =
           1 << ((byte)iVar2 & 0x1f);
    }
  }
  de::Random::~Random((Random *)local_30);
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = 1u<<rnd.getInt(0, numBits-1);
		}
	}